

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::permute_axes(CImg<unsigned_int> *this,char *order)

{
  CImg<unsigned_int> *pCVar1;
  CImg<unsigned_int> local_38;
  char *local_18;
  char *order_local;
  CImg<unsigned_int> *this_local;
  
  local_18 = order;
  order_local = (char *)this;
  get_permute_axes(&local_38,this,order);
  pCVar1 = move_to(&local_38,this);
  ~CImg(&local_38);
  return pCVar1;
}

Assistant:

CImg<T>& permute_axes(const char *const order) {
      return get_permute_axes(order).move_to(*this);
    }